

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float32 float32_exp2_mips64el(float32 a,float_status *status)

{
  flag fVar1;
  uint32_t uVar2;
  int iVar3;
  float64 fVar4;
  float64 b;
  float32 local_54;
  float64 f;
  float64 fStack_40;
  int i;
  float64 xn;
  float64 x;
  float64 r;
  uint32_t aSig;
  int aExp;
  flag aSign;
  float_status *status_local;
  float32 a_local;
  
  local_54 = float32_squash_input_denormal_mips64el(a,status);
  uVar2 = extractFloat32Frac(local_54);
  iVar3 = extractFloat32Exp(local_54);
  fVar1 = extractFloat32Sign(local_54);
  if (iVar3 == 0xff) {
    if (uVar2 == 0) {
      if (fVar1 != '\0') {
        local_54 = 0;
      }
      status_local._4_4_ = local_54;
    }
    else {
      status_local._4_4_ = propagateFloat32NaN(local_54,0,status);
    }
  }
  else if ((iVar3 == 0) && (uVar2 == 0)) {
    status_local._4_4_ = 0x3f800000;
  }
  else {
    float_raise_mips64el(' ',status);
    fVar4 = float32_to_float64_mips64el(local_54,status);
    fVar4 = float64_mul_mips64el(fVar4,0x3fe62e42fefa39ef,status);
    x = 0x3ff0000000000000;
    fStack_40 = fVar4;
    for (f._4_4_ = 0; f._4_4_ < 0xf; f._4_4_ = f._4_4_ + 1) {
      b = float64_mul_mips64el(fStack_40,float32_exp2_coefficients[f._4_4_],status);
      x = float64_add_mips64el(x,b,status);
      fStack_40 = float64_mul_mips64el(fStack_40,fVar4,status);
    }
    status_local._4_4_ = float64_to_float32_mips64el(x,status);
  }
  return status_local._4_4_;
}

Assistant:

float32 float32_exp2(float32 a, float_status *status)
{
    flag aSign;
    int aExp;
    uint32_t aSig;
    float64 r, x, xn;
    int i;
    a = float32_squash_input_denormal(a, status);

    aSig = extractFloat32Frac( a );
    aExp = extractFloat32Exp( a );
    aSign = extractFloat32Sign( a );

    if ( aExp == 0xFF) {
        if (aSig) {
            return propagateFloat32NaN(a, float32_zero, status);
        }
        return (aSign) ? float32_zero : a;
    }
    if (aExp == 0) {
        if (aSig == 0) return float32_one;
    }

    float_raise(float_flag_inexact, status);

    /* ******************************* */
    /* using float64 for approximation */
    /* ******************************* */
    x = float32_to_float64(a, status);
    x = float64_mul(x, float64_ln2, status);

    xn = x;
    r = float64_one;
    for (i = 0 ; i < 15 ; i++) {
        float64 f;

        f = float64_mul(xn, float32_exp2_coefficients[i], status);
        r = float64_add(r, f, status);

        xn = float64_mul(xn, x, status);
    }

    return float64_to_float32(r, status);
}